

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

int NgramBuilder_serialize(NgramBuilder builder,Serializer serializer,void *param)

{
  uint32_t *puVar1;
  byte bVar2;
  byte *pbVar3;
  char **ppcVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  BuilderGram_T *pBVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  undefined1 local_368 [8];
  size_t next_order_offsets [64];
  size_t local_58;
  size_t vocab_mem_size;
  void *local_48;
  uint32_t *local_40;
  Serializer local_38;
  
  if ((ulong)builder->order != 0) {
    uVar7 = 0;
    do {
      if (builder->added_gram_nums[uVar7] != builder->gram_nums[uVar7]) {
        __assert_fail("builder->added_gram_nums[i] == builder->gram_nums[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                      ,0x261,"int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
      }
      uVar7 = uVar7 + 1;
    } while (builder->order != uVar7);
  }
  puVar1 = &builder->order;
  (*serializer)((char *)puVar1,4,param);
  local_40 = puVar1;
  if (*puVar1 != 0) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      (*serializer)((char *)((long)builder->gram_nums + lVar5),8,param);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar7 < builder->order);
  }
  local_58 = HashVocab_serialize_size(builder->vocab);
  (*serializer)((char *)&local_58,8,param);
  HashVocab_serialize(builder->vocab,serializer,param);
  qsort(builder->ngram_offsets,builder->added_total_gram_num,8,ngram_sort_cmp);
  uVar7 = (ulong)builder->order;
  if (uVar7 == 1) {
    if (*builder->gram_nums == 0) {
      uVar6 = 1;
    }
    else {
      uVar7 = 0;
      do {
        pbVar3 = (byte *)builder->ngram_offsets[uVar7];
        bVar2 = *pbVar3;
        next_order_offsets[0x20]._4_4_ = bVar2 & 0x3f;
        lVar5 = 1;
        if ((bVar2 & 0x3f) != 0) {
          uVar8 = 0;
          do {
            *(undefined4 *)((long)next_order_offsets + uVar8 * 4 + -4) =
                 *(undefined4 *)(pbVar3 + lVar5);
            lVar5 = lVar5 + 4;
            uVar8 = uVar8 + 1;
          } while (uVar8 < next_order_offsets[0x20]._4_4_);
        }
        next_order_offsets[0x20]._0_4_ = 0;
        if ((bVar2 & 0x40) != 0) {
          next_order_offsets[0x20]._0_4_ = *(undefined4 *)(pbVar3 + lVar5 + 4);
        }
        next_order_offsets[0x1f]._4_4_ = *(undefined4 *)(pbVar3 + lVar5);
        local_368._0_4_ = 0xffffffff;
        serialize_builder_gram((BuilderGram_T *)local_368,builder->order,serializer,param);
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 < *builder->gram_nums);
      uVar6 = *local_40;
    }
    pBVar9 = (BuilderGram_T *)local_368;
    next_order_offsets._252_8_ = 0xffffffffffffffff;
  }
  else {
    local_368._0_4_ = 0;
    local_368._4_4_ = 0;
    if (builder->order == 0) {
      return 0;
    }
    sVar14 = builder->added_total_gram_num;
    ppcVar4 = builder->ngram_offsets;
    lVar5 = sVar14 - 1;
    uVar8 = 1;
    do {
      sVar12 = 0;
      lVar13 = lVar5;
      if (-1 < lVar5) {
        do {
          uVar11 = lVar13 + sVar12 >> 1;
          if (uVar8 < ((byte)*ppcVar4[uVar11] & 0x3f)) {
            lVar13 = uVar11 - 1;
          }
          else {
            sVar12 = uVar11 + 1;
          }
        } while ((long)sVar12 <= lVar13);
      }
      next_order_offsets[uVar8 - 1] = sVar12;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
    local_38 = serializer;
    local_48 = param;
    next_order_offsets[uVar7 - 1] = sVar14;
    uVar11 = 1;
    uVar8 = 0;
    pBVar9 = (BuilderGram_T *)(next_order_offsets + 0x3f);
    sVar14 = next_order_offsets[0];
    do {
      uVar6 = (uint)uVar7;
      if (uVar8 < sVar14) {
        do {
          ppcVar4 = builder->ngram_offsets;
          pbVar3 = (byte *)ppcVar4[uVar8];
          bVar2 = *pbVar3;
          lVar5 = 1;
          if ((bVar2 & 0x3f) == 0) {
            uVar7 = 0;
          }
          else {
            uVar10 = 0;
            do {
              *(undefined4 *)((long)next_order_offsets + uVar10 * 4 + 0x1fc) =
                   *(undefined4 *)(pbVar3 + lVar5);
              lVar5 = lVar5 + 4;
              uVar10 = uVar10 + 1;
              uVar7 = (ulong)(bVar2 & 0x3f);
            } while (uVar10 < uVar7);
          }
          if (uVar7 != uVar11) {
            __assert_fail("cur_gram.order == cur_order",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                          ,0x28c,
                          "int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
          }
          sVar12 = _bsearch_prefix_start(ppcVar4,builder->added_total_gram_num,pBVar9);
          next_order_offsets[0x3f]._0_4_ = (int)sVar12 - (int)sVar14;
          serialize_builder_gram(pBVar9,builder->order,local_38,local_48);
          uVar8 = uVar8 + 1;
        } while (uVar8 < sVar14);
        uVar6 = *local_40;
      }
      *(undefined4 *)((long)next_order_offsets + uVar11 * 4 + 0x1f8) = 0xffffffff;
      vocab_mem_size = next_order_offsets[uVar11];
      uVar11 = uVar11 + 1;
      next_order_offsets[0x3f]._0_4_ = (int)vocab_mem_size - (int)sVar14;
      serialize_builder_gram(pBVar9,uVar6,local_38,local_48);
      puVar1 = local_40;
      param = local_48;
      uVar6 = *local_40;
      uVar7 = (ulong)uVar6;
      sVar14 = vocab_mem_size;
    } while (uVar11 < uVar7);
    if (uVar6 < 2) {
      return 0;
    }
    uVar7 = (ulong)(uVar6 - 1);
    uVar8 = (ulong)(uint)next_order_offsets[uVar7 - 1];
    if (uVar8 < builder->added_total_gram_num) {
      do {
        pbVar3 = (byte *)builder->ngram_offsets[uVar8];
        bVar2 = *pbVar3;
        lVar5 = 1;
        if ((bVar2 & 0x3f) != 0) {
          uVar7 = 0;
          do {
            *(undefined4 *)((long)next_order_offsets + uVar7 * 4 + 0x1fc) =
                 *(undefined4 *)(pbVar3 + lVar5);
            lVar5 = lVar5 + 4;
            uVar7 = uVar7 + 1;
          } while (uVar7 < (bVar2 & 0x3f));
        }
        next_order_offsets[0x3f]._0_4_ = -1;
        serialize_builder_gram
                  ((BuilderGram_T *)(next_order_offsets + 0x3f),builder->order,local_38,param);
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar8 < builder->added_total_gram_num);
      uVar6 = *puVar1;
      uVar7 = (ulong)(uVar6 - 1);
    }
    serializer = local_38;
    pBVar9 = (BuilderGram_T *)(next_order_offsets + 0x3f);
    *(undefined4 *)((long)next_order_offsets + uVar7 * 4 + 0x1fc) = 0xffffffff;
  }
  serialize_builder_gram(pBVar9,uVar6,serializer,param);
  return 0;
}

Assistant:

int NgramBuilder_serialize(const NgramBuilder builder, Serializer serializer, void* param){
    for (uint32_t i = 0;i<builder->order;i++) {
        assert(builder->added_gram_nums[i] == builder->gram_nums[i]);
    }
    serializer((char*)&builder->order,sizeof(uint32_t), param);
    for (uint32_t i = 0; i < builder->order;i++) {
        serializer((char*)&builder->gram_nums[i],sizeof(size_t), param);
    }
    size_t vocab_mem_size = HashVocab_serialize_size(builder->vocab);
    //printf("serialize vocab_mem_size:%zu\n", vocab_mem_size);
    serializer((char*)&vocab_mem_size,sizeof(vocab_mem_size), param);
    HashVocab_serialize(builder->vocab, serializer, param);

    qsort(builder->ngram_offsets, builder->added_total_gram_num, sizeof(char*), ngram_sort_cmp);
    //now sorted by order, wordids
    //print_ngrams(builder->ngram_offsets, builder->added_total_gram_num);

    if (builder->order == 1) {
        BuilderGram_T gram;
        for (uint32_t i = 0;i< builder->gram_nums[0];i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer ,param);
        }
        gram.bow = -1;
        gram.prob = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
        return 0;
    }
    size_t cur_offset = 0;
    size_t next_order_offsets[MAX_ORDER];
    next_order_offsets[0] = 0;
    for (uint32_t cur_order = 1; cur_order< builder->order;cur_order++) {
        next_order_offsets[cur_order] = _bsearch_order_start(builder->ngram_offsets, builder->added_total_gram_num, cur_order+1);
        //printf("serialize: next_order_offsets[%d]= %zu\n", cur_order, next_order_offsets[cur_order]);
    }

    next_order_offsets[builder->order] = builder->added_total_gram_num;

    for (uint32_t cur_order = 1; cur_order < builder->order; cur_order++) {
        BuilderGram_T cur_gram;
        while (cur_offset < next_order_offsets[cur_order]) {
            _decode_builder_gram(&cur_gram, builder->ngram_offsets[cur_offset]);
            //printf("cur_order:%d\n", cur_order);
            //printf("cur_gram.order:%d\n", cur_gram.order);
            assert(cur_gram.order == cur_order);
            cur_gram.next_arr_idx = _bsearch_prefix_start(builder->ngram_offsets, builder->added_total_gram_num, &cur_gram) - next_order_offsets[cur_order];
            //if (cur_order == 1) {
            //    printf("id:%d\t", cur_offset);
            //}
            serialize_builder_gram(&cur_gram, builder->order, serializer, param); 
            cur_offset += 1;
        }
        cur_gram.wids[cur_order-1] = -1;
        cur_gram.order = cur_order;
        cur_gram.prob = -1;
        cur_gram.bow = -1;
        cur_gram.next_arr_idx = next_order_offsets[cur_order+1] - next_order_offsets[cur_order];
        serialize_builder_gram(&cur_gram, builder->order, serializer, param);
    }
    if (builder->order > 1) {
        BuilderGram_T gram;
        gram.order = builder->order;
        for (uint32_t i =  next_order_offsets[builder->order-1];i< builder->added_total_gram_num;i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer, param);
        }
        gram.bow = -1;
        gram.prob = -1;
        gram.wids[builder->order-1] = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
    }
    return 0; 
}